

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O1

void __thiscall Centaurus::Grammar<char>::print_ldfa(Grammar<char> *this,wostream *os,ATNPath *path)

{
  LookaheadDFA<char> ldfa;
  CompositeATN<char> catn;
  LookaheadDFA<char> local_80;
  CompositeATN<char> local_60;
  
  CompositeATN<char>::CompositeATN(&local_60,this);
  LookaheadDFA<char>::LookaheadDFA(&local_80,&local_60,path,true);
  LookaheadDFA<char>::print
            (&local_80,os,
             &(path->
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ).
              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].first.m_id);
  local_80.super_NFABase<Centaurus::LDFAState<char>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a1b10;
  std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::~vector
            (&local_80.super_NFABase<Centaurus::LDFAState<char>_>.m_states);
  local_60._vptr_CompositeATN = (_func_int **)&PTR__CompositeATN_001a1c68;
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60.m_dict._M_h);
  return;
}

Assistant:

void Grammar<TCHAR>::print_ldfa(std::wostream& os, const ATNPath& path) const
{
    CompositeATN<TCHAR> catn(*this);

    LookaheadDFA<TCHAR> ldfa(catn, path);

    ldfa.print(os, path.leaf_id().str());
}